

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O1

void __thiscall ChUll::ChUll(ChUll *this,ConvexResult *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ConvexResult *this_00;
  float fVar7;
  
  this_00 = (ConvexResult *)::operator_new(0xa8);
  ConvexDecomposition::ConvexResult::ConvexResult(this_00,result);
  *(ConvexResult **)&this->mDiagonal = this_00;
  fVar7 = computeMeshVolume(result->mHullVertices,result->mHullTcount,result->mHullIndices);
  this->mMax[2] = (HaF32)fVar7;
  fVar7 = getBoundingRegion(result->mHullVcount,result->mHullVertices,0xc,(float *)this,
                            (float *)(this->mMin + 2));
  this->mVolume = (HaF32)fVar7;
  fVar7 = (float)this->mMin[2];
  fVar1 = (float)this->mMax[0];
  fVar2 = (float)this->mMax[1];
  fVar3 = (float)this->mMin[1];
  fVar4 = (fVar7 - (float)this->mGuid) * 0.1;
  fVar5 = (fVar1 - (float)this->mMin[0]) * 0.1;
  fVar6 = (fVar2 - fVar3) * 0.1;
  this->mGuid = (HaU32)((float)this->mGuid - fVar4);
  this->mMin[0] = (HaF32)((float)this->mMin[0] - fVar5);
  this->mMin[1] = (HaF32)(fVar3 - fVar6);
  this->mMin[2] = (HaF32)(fVar7 + fVar4);
  this->mMax[0] = (HaF32)(fVar1 + fVar5);
  this->mMax[1] = (HaF32)(fVar6 + fVar2);
  return;
}

Assistant:

ChUll::ChUll(const ConvexResult &result)
{
	mResult = new ConvexResult(result);
	mVolume = computeMeshVolume( result.mHullVertices, result.mHullTcount, result.mHullIndices );

	mDiagonal = getBoundingRegion( result.mHullVcount, result.mHullVertices, sizeof(float)*3, mMin, mMax );

	float dx = mMax[0] - mMin[0];
	float dy = mMax[1] - mMin[1];
	float dz = mMax[2] - mMin[2];

	dx*=0.1f; // inflate 1/10th on each edge
	dy*=0.1f; // inflate 1/10th on each edge
	dz*=0.1f; // inflate 1/10th on each edge

	mMin[0]-=dx;
	mMin[1]-=dy;
	mMin[2]-=dz;

	mMax[0]+=dx;
	mMax[1]+=dy;
	mMax[2]+=dz;


}